

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall
clipp::parser::try_match_joined<clipp::detail::select_all>
          (parser *this,group *joinGroup,arg_string *arg,select_all *select,arg_string *prefix)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  parser *in_RDX;
  value_type *in_R8;
  match_t *m;
  iterator __end2_1;
  iterator __begin2_1;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *__range2_1;
  arg_mapping *a;
  iterator __end2;
  iterator __begin2;
  arg_mappings *__range2;
  select_all *in_stack_00000088;
  arg_string *in_stack_00000090;
  scoped_dfs_traverser *in_stack_00000098;
  match_t match;
  vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> matches;
  parser parse;
  value_type *in_stack_fffffffffffffd08;
  reference in_stack_fffffffffffffd20;
  __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
  local_2d0;
  scoped_dfs_traverser *in_stack_fffffffffffffd38;
  scoped_dfs_traverser *in_stack_fffffffffffffd40;
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  local_2b0;
  undefined1 *local_2a8;
  int local_2a0;
  arg_index in_stack_fffffffffffffd64;
  group *in_stack_fffffffffffffd68;
  parser *in_stack_fffffffffffffd70;
  match_t *in_stack_fffffffffffffe68;
  parser *in_stack_fffffffffffffe70;
  undefined1 auStack_68 [56];
  value_type *local_30;
  byte local_1;
  
  local_30 = in_R8;
  parser(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64);
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::vector
            ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)0x1a03e5);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) ||
         (bVar2 = std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::
                  empty((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                        in_stack_fffffffffffffd20), bVar2)) {
        local_1 = 0;
        local_2a0 = 1;
      }
      else {
        bVar2 = std::
                vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                ::empty((vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
                         *)in_stack_fffffffffffffd20);
        if (bVar2) {
          local_2a8 = auStack_68;
          local_2b0._M_current =
               (arg_mapping *)
               std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
               ::begin((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                        *)in_stack_fffffffffffffd08);
          std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::end
                    ((vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
                      *)in_stack_fffffffffffffd08);
          goto LAB_001a064b;
        }
        local_1 = 0;
        local_2a0 = 1;
      }
      break;
    }
    detail::scoped_dfs_traverser::scoped_dfs_traverser
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    detail::longest_prefix_match<clipp::detail::select_all>
              (in_stack_00000098,in_stack_00000090,in_stack_00000088);
    detail::scoped_dfs_traverser::~scoped_dfs_traverser((scoped_dfs_traverser *)in_RDX);
    bVar2 = detail::match_t::operator_cast_to_bool((match_t *)0x1a0446);
    if (bVar2) {
      detail::match_t::str_abi_cxx11_((match_t *)&stack0xfffffffffffffe10);
      std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)in_RDX,0);
      uVar4 = std::__cxx11::string::empty();
      if ((((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) &&
         (lVar3 = std::__cxx11::string::find((string *)in_RDX,(ulong)local_30), lVar3 != 0)) {
        in_stack_fffffffffffffd08 = local_30;
        detail::match_t::str_abi_cxx11_((match_t *)&stack0xfffffffffffffe10);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_RDX,&in_stack_fffffffffffffd08->str_);
        if (bVar2) {
          std::__cxx11::string::insert((ulong)in_RDX,(string *)0x0);
        }
      }
      add_match(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::push_back
                ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)in_RDX,
                 in_stack_fffffffffffffd08);
      local_2a0 = 0;
    }
    else {
      local_1 = 0;
      local_2a0 = 1;
    }
    detail::match_t::~match_t((match_t *)in_RDX);
  } while (local_2a0 == 0);
LAB_001a0720:
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::~vector
            ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
             in_stack_fffffffffffffd20);
  ~parser(in_RDX);
  return (bool)(local_1 & 1);
LAB_001a064b:
  bVar2 = __gnu_cxx::operator!=
                    ((__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
                      *)in_RDX,
                     (__normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
                      *)in_stack_fffffffffffffd08);
  if (!bVar2) goto LAB_001a06a2;
  __gnu_cxx::
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  ::operator*(&local_2b0);
  bVar2 = arg_mapping::any_error((arg_mapping *)in_RDX);
  if (bVar2) {
    local_1 = 0;
    local_2a0 = 1;
    goto LAB_001a0720;
  }
  __gnu_cxx::
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  ::operator++(&local_2b0);
  goto LAB_001a064b;
LAB_001a06a2:
  local_2d0._M_current =
       (match_t *)
       std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::begin
                 ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
                  in_stack_fffffffffffffd08);
  std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>::end
            ((vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_> *)
             in_stack_fffffffffffffd08);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                             *)in_RDX,
                            (__normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
                             *)in_stack_fffffffffffffd08), bVar2) {
    in_stack_fffffffffffffd20 =
         __gnu_cxx::
         __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
         ::operator*(&local_2d0);
    add_match(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __gnu_cxx::
    __normal_iterator<clipp::detail::match_t_*,_std::vector<clipp::detail::match_t,_std::allocator<clipp::detail::match_t>_>_>
    ::operator++(&local_2d0);
  }
  local_1 = 1;
  local_2a0 = 1;
  goto LAB_001a0720;
}

Assistant:

bool try_match_joined(const group& joinGroup, arg_string arg,
                          const ParamSelector& select,
                          const arg_string& prefix = "")
    {
        //temporary parser with 'joinGroup' as top-level group
        parser parse {joinGroup};
        //records temporary matches
        std::vector<match_t> matches;

        while(!arg.empty()) {
            auto match = detail::longest_prefix_match(parse.pos_, arg, select);

            if(!match) return false;

            arg.erase(0, match.str().size());
            //make sure prefix is always present after the first match
            //so that, e.g., flags "-a" and "-b" will be found in "-ab"
            if(!arg.empty() && !prefix.empty() && arg.find(prefix) != 0 &&
                prefix != match.str())
            {
                arg.insert(0,prefix);
            }

            parse.add_match(match);
            matches.push_back(std::move(match));
        }

        if(!arg.empty() || matches.empty()) return false;

        if(!parse.missCand_.empty()) return false;
        for(const auto& a : parse.args_) if(a.any_error()) return false;

        //replay matches onto *this
        for(const auto& m : matches) add_match(m);
        return true;
    }